

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uchar *puVar12;
  CImgArgumentException *this_00;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uchar *puVar17;
  uchar *puVar18;
  uchar *puVar19;
  int z;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  int y;
  int iVar26;
  int iVar27;
  long lVar28;
  char *pcVar29;
  int iVar30;
  long lVar31;
  uchar *puVar32;
  uchar *puVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  int iVar37;
  float fVar38;
  CImg<unsigned_char> local_58;
  long local_38;
  
  puVar18 = this->_data;
  if (puVar18 != (uchar *)0x0) {
    uVar36 = this->_width;
    uVar24 = (ulong)uVar36;
    if (uVar36 != 0) {
      uVar1 = this->_height;
      if (uVar1 != 0) {
        uVar2 = this->_depth;
        if ((((uVar2 != 0) && (this->_spectrum != 0)) &&
            (puVar32 = sprite->_data, puVar32 != (uchar *)0x0)) &&
           (puVar12 = mask->_data, puVar12 != (uchar *)0x0)) {
          local_38 = uVar1 * uVar24;
          uVar3 = this->_spectrum;
          uVar4 = sprite->_width;
          uVar25 = (ulong)uVar4;
          uVar5 = sprite->_height;
          uVar6 = sprite->_depth;
          uVar7 = sprite->_spectrum;
          if ((puVar32 < puVar18 + (ulong)uVar2 * (ulong)uVar3 * local_38) &&
             (puVar18 < puVar32 + (ulong)uVar6 * (ulong)uVar7 * uVar5 * uVar25)) {
            CImg(&local_58,sprite,false);
            this = draw_image<unsigned_char,unsigned_char>
                             (this,x0,y0,z0,c0,&local_58,mask,opacity,mask_max_value);
          }
          else {
            uVar8 = mask->_width;
            uVar9 = mask->_height;
            uVar10 = mask->_depth;
            uVar11 = mask->_spectrum;
            if ((puVar18 + (ulong)uVar2 * (ulong)uVar3 * local_38 <= puVar12) ||
               (puVar12 + (ulong)uVar10 * (ulong)uVar11 * (ulong)uVar9 * (ulong)uVar8 <= puVar18)) {
              if (((uVar8 != uVar4) || (uVar9 != uVar5)) || (uVar10 != uVar6)) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
                pcVar29 = "non-";
                if (this->_is_shared != false) {
                  pcVar29 = "";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                           ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                           (ulong)this->_spectrum,this->_data,pcVar29,"unsigned char",
                           (ulong)sprite->_width,(ulong)sprite->_height,(ulong)sprite->_depth,
                           (ulong)sprite->_spectrum,sprite->_data,(ulong)mask->_width,
                           (ulong)mask->_height,(ulong)mask->_depth,(ulong)mask->_spectrum,
                           mask->_data);
                __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
              }
              iVar23 = uVar36 - (uVar4 + x0);
              if ((int)(uVar4 + x0) <= (int)uVar36) {
                iVar23 = 0;
              }
              uVar36 = x0 >> 0x1f & x0;
              iVar23 = iVar23 + uVar4 + uVar36;
              iVar26 = uVar1 - (uVar5 + y0);
              if ((int)(uVar5 + y0) <= (int)uVar1) {
                iVar26 = 0;
              }
              iVar37 = uVar2 - (z0 + uVar6);
              if ((int)(z0 + uVar6) <= (int)uVar2) {
                iVar37 = 0;
              }
              iVar30 = uVar3 - (c0 + uVar7);
              if ((int)(c0 + uVar7) <= (int)uVar3) {
                iVar30 = 0;
              }
              if (iVar23 < 1) {
                return this;
              }
              iVar26 = (y0 >> 0x1f & y0) + uVar5 + iVar26;
              if (iVar26 < 1) {
                return this;
              }
              iVar37 = (z0 >> 0x1f & z0) + uVar6 + iVar37;
              if (iVar37 < 1) {
                return this;
              }
              iVar30 = uVar7 + (c0 >> 0x1f & c0) + iVar30;
              if (iVar30 < 1) {
                return this;
              }
              iVar21 = uVar10 * uVar9 * uVar8;
              lVar28 = (long)iVar23;
              iVar13 = -((z0 >> 0x1f & uVar9 * uVar8 * z0) + uVar36 + (y0 >> 0x1f & uVar8 * y0) +
                        (c0 >> 0x1f & iVar21 * c0));
              puVar12 = puVar12 + iVar13;
              puVar32 = puVar32 + iVar13;
              uVar34 = (ulong)(uint)x0;
              if (x0 < 1) {
                uVar34 = 0;
              }
              uVar22 = (ulong)(uint)y0;
              if (y0 < 1) {
                uVar22 = 0;
              }
              uVar14 = (ulong)(uint)z0;
              if (z0 < 1) {
                uVar14 = 0;
              }
              iVar13 = 0;
              uVar15 = (ulong)(uint)c0;
              if (c0 < 1) {
                uVar15 = 0;
              }
              puVar18 = puVar18 + (ulong)uVar2 * local_38 * uVar15 +
                                  uVar14 * local_38 + uVar22 * uVar24 + uVar34;
              lVar16 = ((ulong)uVar5 * (ulong)(uVar6 - iVar37) + (ulong)(uVar5 - iVar26) + 1) *
                       uVar25 - lVar28;
              lVar31 = ((ulong)(uVar5 - iVar26) + 1) * uVar25 - lVar28;
              do {
                puVar17 = mask->_data +
                          ((long)puVar12 - (long)mask->_data) % (long)(int)(uVar11 * iVar21);
                iVar20 = 0;
                do {
                  iVar27 = 0;
                  do {
                    puVar33 = puVar32;
                    puVar19 = puVar18;
                    puVar12 = puVar17;
                    lVar35 = 0;
                    do {
                      fVar38 = (float)puVar12[lVar35] * opacity;
                      puVar19[lVar35] =
                           (uchar)(int)(((float)puVar33[lVar35] * ABS(fVar38) +
                                        (float)puVar19[lVar35] *
                                        (mask_max_value -
                                        (float)(-(uint)(0.0 <= fVar38) & (uint)fVar38))) /
                                       mask_max_value);
                      lVar35 = lVar35 + 1;
                    } while ((int)lVar35 < iVar23);
                    iVar27 = iVar27 + 1;
                    puVar17 = puVar12 + lVar35 + (uVar25 - lVar28);
                    puVar18 = puVar19 + lVar35 + (uVar24 - lVar28);
                    puVar32 = puVar33 + lVar35 + (uVar25 - lVar28);
                  } while (iVar27 < iVar26);
                  puVar18 = puVar19 + lVar35 + (((ulong)(uVar1 - iVar26) + 1) * uVar24 - lVar28);
                  puVar32 = puVar33 + lVar35 + lVar31;
                  puVar17 = puVar12 + lVar35 + lVar31;
                  iVar20 = iVar20 + 1;
                } while (iVar20 < iVar37);
                puVar18 = puVar19 + lVar35 + (((ulong)(uVar1 - iVar26) +
                                               (ulong)uVar1 * (ulong)(uVar2 - iVar37) + 1) * uVar24
                                             - lVar28);
                puVar32 = puVar33 + lVar35 + lVar16;
                puVar12 = puVar12 + lVar35 + lVar16;
                iVar13 = iVar13 + 1;
              } while (iVar13 < iVar30);
              return this;
            }
            CImg(&local_58,mask,false);
            this = draw_image<unsigned_char,unsigned_char>
                             (this,x0,y0,z0,c0,sprite,&local_58,opacity,mask_max_value);
          }
          if ((local_58._is_shared == false) && (local_58._data != (uchar *)0x0)) {
            operator_delete__(local_58._data);
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask))   return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const int
        coff = -(bx?x0:0)-(by?y0*mask.width():0)-(bz?z0*mask.width()*mask.height():0)-(bc?c0*mask.width()*mask.height()*mask.depth():0),
        ssize = mask.width()*mask.height()*mask.depth()*mask.spectrum();
      const ti *ptrs = sprite._data + coff;
      const tm *ptrm = mask._data   + coff;
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
	T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int c = 0; c<lC; ++c) {
          ptrm = mask._data + (ptrm - mask._data)%ssize;
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              for (int x = 0; x<lX; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - cimg::max(mopacity,0);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
              ptrd+=offX; ptrs+=soffX; ptrm+=soffX;
            }
            ptrd+=offY; ptrs+=soffY; ptrm+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ; ptrm+=soffZ;
        }
      }
      return *this;
    }